

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

GLuint gl4cts::StencilTexturing::Utils::createAndCompileShader
                 (Context *context,GLenum type,GLchar *code)

{
  code *pcVar1;
  undefined4 uVar2;
  GLuint GVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  exception *exc;
  Enum<int,_2UL> local_1f0;
  MessageBuilder local_1e0;
  undefined1 local_60 [8];
  string message;
  GLint length;
  int local_30;
  GLuint local_2c;
  GLint status;
  GLuint id;
  Functions *gl;
  GLchar *code_local;
  Context *pCStack_10;
  GLenum type_local;
  Context *context_local;
  
  gl = (Functions *)code;
  code_local._4_4_ = type;
  pCStack_10 = context;
  pRVar6 = deqp::Context::getRenderContext(context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  _status = CONCAT44(extraout_var,iVar4);
  local_2c = (**(code **)(_status + 0x3f0))(code_local._4_4_);
  local_30 = 0;
  dVar5 = (**(code **)(_status + 0x800))();
  glu::checkError(dVar5,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xcf);
  (**(code **)(_status + 0x12b8))(local_2c,1,&gl,0);
  dVar5 = (**(code **)(_status + 0x800))();
  glu::checkError(dVar5,"ShaderSource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xd4);
  (**(code **)(_status + 0x248))(local_2c);
  dVar5 = (**(code **)(_status + 0x800))();
  glu::checkError(dVar5,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xd8);
  (**(code **)(_status + 0xa70))(local_2c,0x8b81,&local_30);
  dVar5 = (**(code **)(_status + 0x800))();
  glu::checkError(dVar5,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xdc);
  if (local_30 != 1) {
    message.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_60);
    (**(code **)(_status + 0xa70))(local_2c,0x8b84,(undefined1 *)((long)&message.field_2 + 8));
    dVar5 = (**(code **)(_status + 0x800))();
    glu::checkError(dVar5,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0xe6);
    std::__cxx11::string::resize((ulong)local_60,(char)message.field_2._8_4_);
    GVar3 = local_2c;
    uVar2 = message.field_2._8_4_;
    pcVar1 = *(code **)(_status + 0xa58);
    uVar7 = std::__cxx11::string::operator[]((ulong)local_60);
    (*pcVar1)(GVar3,uVar2,0,uVar7);
    dVar5 = (**(code **)(_status + 0x800))();
    glu::checkError(dVar5,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0xed);
    this = deqp::Context::getTestContext(pCStack_10);
    this_00 = tcu::TestContext::getLog(this);
    tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [9])"Shader (");
    EVar9 = glu::getShaderTypeStr(code_local._4_4_);
    local_1f0.m_getName = EVar9.m_getName;
    local_1f0.m_value = EVar9.m_value;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])") compilation failed: ");
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_60);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    deleteShader(pCStack_10,local_2c);
    local_2c = 0;
    std::__cxx11::string::~string((string *)local_60);
  }
  return local_2c;
}

Assistant:

GLuint Utils::createAndCompileShader(deqp::Context& context, const GLenum type, const GLchar* code)
{
	const Functions& gl		= context.getRenderContext().getFunctions();
	GLuint			 id		= gl.createShader(type);
	GLint			 status = GL_FALSE;

	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	try
	{
		gl.shaderSource(id, 1 /* count */, &code, 0 /* lengths */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderSource");

		/* Compile */
		gl.compileShader(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

		/* Get compilation status */
		gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Log compilation error */
		if (GL_TRUE != status)
		{
			glw::GLint  length = 0;
			std::string message;

			/* Error log length */
			gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

			/* Prepare storage */
			message.resize(length, 0);

			/* Get error log */
			gl.getShaderInfoLog(id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

			context.getTestContext().getLog() << tcu::TestLog::Message << "Shader (" << glu::getShaderTypeStr(type)
											  << ") compilation failed: " << message << tcu::TestLog::EndMessage;

			deleteShader(context, id);
			id = 0;
		}
	}
	catch (std::exception& exc)
	{
		deleteShader(context, id);
		throw exc;
	}

	return id;
}